

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fullscreen.c
# Opt level: O2

int main(void)

{
  _Bool _Var1;
  mfb_update_state mVar2;
  uint uVar3;
  mfb_window *window;
  long lVar4;
  uint uVar5;
  
  window = mfb_open_ex("full screen auto",0x3c0,0x280,2);
  if (window != (mfb_window *)0x0) {
    mfb_set_viewport_best_fit(window,0x3c0,0x280);
    uVar5 = 0xbeef;
    lVar4 = 0;
    do {
      for (; lVar4 != 0x96000; lVar4 = lVar4 + 1) {
        uVar3 = (int)uVar5 >> 3 ^ uVar5;
        uVar5 = (int)uVar5 >> 1 | (uVar3 & 1) << 0x1e;
        g_buffer[lVar4] = (uVar3 >> 1 & 0xff) * 0x10101;
      }
      mVar2 = mfb_update(window,g_buffer);
      if (mVar2 != STATE_OK) {
        return 0;
      }
      _Var1 = mfb_wait_sync(window);
      lVar4 = 0;
    } while (_Var1);
  }
  return 0;
}

Assistant:

int
main()
{
    int noise, carry, seed = 0xbeef;

    struct mfb_window *window = mfb_open_ex("full screen auto", WIDTH, HEIGHT, WF_FULLSCREEN);
    if (!window)
        return 0;

    mfb_set_viewport_best_fit(window, WIDTH, HEIGHT);

    do {
        int              i;
        mfb_update_state state;

        if(g_active)
        {
            for (i = 0; i < WIDTH * HEIGHT; ++i)
            {
                noise = seed;
                noise >>= 3;
                noise ^= seed;
                carry = noise & 1;
                noise >>= 1;
                seed >>= 1;
                seed |= (carry << 30);
                noise &= 0xFF;
                g_buffer[i] = MFB_RGB(noise, noise, noise);
            }

            state = mfb_update(window, g_buffer);
        }
        else {
            state = mfb_update_events(window);
        }
        if (state != STATE_OK) {
            window = 0x0;
            break;
        }
    } while(mfb_wait_sync(window));

    return 0;
}